

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_band_offset_luma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,WORD32 sao_band_pos,WORD8 *pi1_sao_offset,WORD32 wd,
               WORD32 ht)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  UWORD8 *pUVar7;
  ulong uVar8;
  int aiStack_a8 [10];
  WORD32 band_table [32];
  
  uVar8 = 0;
  uVar6 = 0;
  if (0 < ht) {
    uVar6 = (ulong)(uint)ht;
  }
  pUVar7 = pu1_src + (long)wd + -1;
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    pu1_src_left[uVar8] = *pUVar7;
    pUVar7 = pUVar7 + src_strd;
  }
  *pu1_src_top_left = pu1_src_top[(long)wd + -1];
  uVar5 = 0;
  uVar8 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar8 = uVar5;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    pu1_src_top[uVar5] = pu1_src[uVar5 + (long)((ht + -1) * src_strd)];
  }
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    aiStack_a8[lVar3] = 0;
  }
  iVar2 = 0;
  while (iVar2 != 4) {
    uVar1 = sao_band_pos + iVar2;
    iVar2 = iVar2 + 1;
    aiStack_a8[uVar1 & 0x1f] = iVar2;
  }
  for (iVar2 = 0; iVar2 != (int)uVar6; iVar2 = iVar2 + 1) {
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = (int)pi1_sao_offset[aiStack_a8[pu1_src[uVar5] >> 3]] + (uint)pu1_src[uVar5];
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      pu1_src[uVar5] = (UWORD8)iVar4;
    }
    pu1_src = pu1_src + src_strd;
  }
  return;
}

Assistant:

void ihevc_sao_band_offset_luma(UWORD8 *pu1_src,
                                WORD32 src_strd,
                                UWORD8 *pu1_src_left,
                                UWORD8 *pu1_src_top,
                                UWORD8 *pu1_src_top_left,
                                WORD32 sao_band_pos,
                                WORD8 *pi1_sao_offset,
                                WORD32 wd,
                                WORD32 ht)
{
    WORD32 band_shift;
    WORD32 band_table[NUM_BAND_TABLE];
    WORD32 i;
    WORD32 row, col;

    /* Updating left and top and top-left */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = pu1_src[row * src_strd + (wd - 1)];
    }
    pu1_src_top_left[0] = pu1_src_top[wd - 1];
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    band_shift = BIT_DEPTH_LUMA - 5;
    for(i = 0; i < NUM_BAND_TABLE; i++)
    {
        band_table[i] = 0;
    }
    for(i = 0; i < 4; i++)
    {
        band_table[(i + sao_band_pos) & 31] = i + 1;
    }

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            WORD32 band_idx;

            band_idx = band_table[pu1_src[col] >> band_shift];
            pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[band_idx], 0, (1 << (band_shift + 5)) - 1);
        }
        pu1_src += src_strd;
    }
}